

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O2

bool ELFIO::elfio::is_subsequence_of(segment *seg1,segment *seg2)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar2 = (*seg1->_vptr_segment[0x1b])();
  iVar3 = (*seg2->_vptr_segment[0x1b])(seg2);
  if ((ulong)(((long *)CONCAT44(extraout_var,iVar2))[1] - *(long *)CONCAT44(extraout_var,iVar2)) <
      (ulong)(((long *)CONCAT44(extraout_var_00,iVar3))[1] -
             *(long *)CONCAT44(extraout_var_00,iVar3))) {
    bVar1 = std::
            __includes<__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      ();
    return bVar1;
  }
  return false;
}

Assistant:

static bool is_subsequence_of( const segment* seg1, const segment* seg2 )
    {
        // Return 'true' if sections of seg1 are a subset of sections in seg2
        const std::vector<Elf_Half>& sections1 = seg1->get_sections();
        const std::vector<Elf_Half>& sections2 = seg2->get_sections();

        bool found = false;
        if ( sections1.size() < sections2.size() ) {
            found = std::includes( sections2.begin(), sections2.end(),
                                   sections1.begin(), sections1.end() );
        }

        return found;
    }